

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nonogram.cpp
# Opt level: O1

Known * __thiscall
Nonogram::get_board_horizontal(Known *__return_storage_ptr__,Nonogram *this,uint y,Board *board)

{
  int iVar1;
  ulong uVar2;
  pointer pvVar3;
  pointer pvVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  vector<bool,_std::allocator<bool>_> set;
  vector<bool,_std::allocator<bool>_> value;
  allocator_type local_82;
  allocator_type local_81;
  vector<bool,_std::allocator<bool>_> local_80;
  vector<bool,_std::allocator<bool>_> local_58;
  
  local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       ((ulong)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_80,(long)this->m_x,(bool *)&local_58,&local_82);
  local_82 = (allocator_type)0x0;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_58,(long)this->m_x,(bool *)&local_82,&local_81);
  iVar1 = this->m_x;
  if (0 < (long)iVar1) {
    pvVar3 = (board->first).
             super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar4 = (board->second).
             super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = 1L << ((byte)y & 0x3f);
    uVar2 = 0;
    do {
      uVar6 = 1L << ((byte)uVar2 & 0x3f);
      uVar7 = uVar2 >> 6;
      if ((*(ulong *)(*(long *)&(pvVar3->super__Bvector_base<std::allocator<bool>_>)._M_impl +
                     (ulong)(y >> 6) * 8) & uVar5) == 0) {
        uVar8 = ~uVar6 & local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar7];
      }
      else {
        uVar8 = local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p[uVar7] | uVar6;
      }
      local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p[uVar7] = uVar8;
      if ((*(ulong *)(*(long *)&(pvVar4->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                super__Bvector_impl_data + (ulong)(y >> 6) * 8) & uVar5) == 0) {
        uVar6 = ~uVar6 & local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar7];
      }
      else {
        uVar6 = uVar6 | local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar7];
      }
      local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p[uVar7] = uVar6;
      uVar2 = uVar2 + 1;
      pvVar3 = pvVar3 + 1;
      pvVar4 = pvVar4 + 1;
    } while ((long)iVar1 != uVar2);
  }
  std::pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>_>::
  pair<std::vector<bool,_std::allocator<bool>_>_&,_std::vector<bool,_std::allocator<bool>_>_&,_true>
            (__return_storage_ptr__,&local_80,&local_58);
  if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Known Nonogram::get_board_horizontal(unsigned int y, const Board &board) const {
    vector<bool> set(m_x), value(m_x);

    for (int i = 0; i < m_x; i++) {
        set[i] = board.first[i][y];
        value[i] = board.second[i][y];
    }

    return {set, value};
}